

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O0

void __thiscall asl::XdlEncoder::_encode(XdlEncoder *this,Var *v)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Array<char> *this_00;
  char *x;
  Var *pVVar5;
  EnumWrapper<const_asl::Var> *pEVar6;
  String *pSVar7;
  char *local_188;
  bool local_14e;
  bool local_14d;
  bool local_14c;
  bool local_14b;
  bool local_14a;
  bool local_149;
  Var *local_148;
  String local_130;
  String local_118;
  String *local_100;
  String *name;
  Var *value;
  EnumWrapper<asl::Var> local_e8;
  EnumWrapper<asl::Var> *local_c0;
  EnumWrapper_ *_b_;
  int local_9c;
  int k;
  String *local_80;
  Var *cname;
  int local_60;
  int i_1;
  String local_50;
  bool local_35;
  int local_34;
  int iStack_30;
  bool big;
  int m;
  int i;
  bool multi;
  Var *v0;
  Var *pVStack_18;
  int n;
  Var *v_local;
  XdlEncoder *this_local;
  
  pVStack_18 = v;
  v_local = (Var *)this;
  switch(v->_type) {
  case NONE:
    asl::String::operator<<(&this->_out,"null");
    break;
  case NUL:
    asl::String::operator<<(&this->_out,"null");
    break;
  case NUMBER:
    new_number(this,(v->field_1)._d);
    break;
  case BOOL:
    new_bool(this,(bool)((v->field_1)._a._space[0] & 1));
    break;
  case INT:
    new_number(this,(v->field_1)._i);
    break;
  case SSTRING:
    new_string(this,(v->field_1)._ss);
    break;
  case FLOAT:
    new_number(this,(float)(v->field_1)._d);
    break;
  case STRING:
    this_00 = StaticSpace<asl::Array<char>_>::operator->(&(v->field_1)._s);
    x = Array<char>::data(this_00);
    new_string(this,x);
    break;
  case ARRAY:
    begin_array(this);
    v0._4_4_ = Var::length(pVStack_18);
    if (v0._4_4_ < 1) {
      local_148 = pVStack_18;
    }
    else {
      local_148 = Var::operator[](pVStack_18,0);
    }
    _i = local_148;
    local_149 = false;
    if ((this->_pretty & 1U) != 0) {
      local_14a = true;
      if (v0._4_4_ < 0xb) {
        local_14b = false;
        if (0 < v0._4_4_) {
          bVar2 = Var::is(local_148,ARRAY);
          local_14c = true;
          if (!bVar2) {
            local_14c = Var::is(_i,DIC);
          }
          local_14b = local_14c;
        }
        local_14a = local_14b;
      }
      local_149 = local_14a;
    }
    m._3_1_ = local_149;
    if ((((this->_pretty & 1U) != 0) && (local_149 == false)) && (bVar2 = Var::is(_i,STRING), bVar2)
       ) {
      local_34 = 0;
      for (iStack_30 = 0; iStack_30 < v0._4_4_; iStack_30 = iStack_30 + 1) {
        pVVar5 = Var::operator[](pVStack_18,iStack_30);
        iVar4 = Var::length(pVVar5);
        local_34 = iVar4 + local_34;
        if (100 < local_34) {
          m._3_1_ = 1;
          break;
        }
      }
    }
    local_35 = false;
    if ((m._3_1_ & 1) != 0) {
      local_14d = false;
      if (0 < v0._4_4_) {
        bVar2 = Var::is(_i,ARRAY);
        local_14e = true;
        if (!bVar2) {
          bVar2 = Var::is(_i,DIC);
          local_14e = true;
          if (!bVar2) {
            local_14e = Var::is(_i,STRING);
          }
        }
        local_14d = local_14e;
      }
      local_35 = local_14d;
      iVar4 = this->_level + 1;
      this->_level = iVar4;
      asl::String::repeat(&local_50,'\t',iVar4);
      asl::String::operator=(&this->_indent,&local_50);
      asl::String::~String(&local_50);
      pSVar7 = asl::String::operator<<(&this->_out,'\n');
      asl::String::operator<<(pSVar7,&this->_indent);
    }
    for (local_60 = 0; iVar4 = local_60, iVar3 = Var::length(pVStack_18), iVar4 < iVar3;
        local_60 = local_60 + 1) {
      if (0 < local_60) {
        if (((m._3_1_ & 1) == 0) || (((local_35 & 1U) == 0 && (local_60 % 0x10 != 0)))) {
          asl::String::operator<<(&this->_out,&this->_sep1);
        }
        else {
          pSVar7 = asl::String::operator<<(&this->_out,&this->_sep2);
          pSVar7 = asl::String::operator<<(pSVar7,'\n');
          asl::String::operator<<(pSVar7,&this->_indent);
        }
      }
      pVVar5 = Var::operator[](pVStack_18,local_60);
      _encode(this,pVVar5);
    }
    if ((m._3_1_ & 1) != 0) {
      iVar4 = this->_level + -1;
      this->_level = iVar4;
      asl::String::repeat((String *)&cname,'\t',iVar4);
      asl::String::operator=(&this->_indent,(String *)&cname);
      asl::String::~String((String *)&cname);
      pSVar7 = asl::String::operator<<(&this->_out,'\n');
      asl::String::operator<<(pSVar7,&this->_indent);
    }
    end_array(this);
    break;
  case DIC:
    local_80 = (String *)0x0;
    if ((this->_json & 1U) == 0) {
      asl::String::String((String *)&stack0xffffffffffffff68,"$type");
      local_80 = (String *)Var::getp(v,(String *)&stack0xffffffffffffff68);
      asl::String::~String((String *)&stack0xffffffffffffff68);
      if (local_80 == (String *)0x0) {
        local_188 = "";
      }
      else {
        local_188 = Var::operator*((Var *)local_80);
      }
      begin_object(this,local_188);
    }
    else {
      begin_object(this,"");
    }
    local_9c = 0;
    if ((this->_pretty & 1U) != 0) {
      iVar4 = this->_level + 1;
      this->_level = iVar4;
      asl::String::repeat((String *)&_b_,'\t',iVar4);
      asl::String::operator=(&this->_indent,(String *)&_b_);
      asl::String::~String((String *)&_b_);
    }
    newEnumerator<asl::Var>(&local_e8,pVStack_18);
    local_c0 = &local_e8;
    while( true ) {
      pEVar6 = enumData<asl::Var_const>((Var *)0x0,&local_c0->super_EnumWrapper_);
      bVar1 = EnumWrapper::operator_cast_to_bool((EnumWrapper *)pEVar6);
      bVar2 = false;
      if (bVar1) {
        bVar2 = (local_c0->super_EnumWrapper_).more != 0;
      }
      if (!bVar2) break;
      pEVar6 = enumData<asl::Var_const>((Var *)0x0,&local_c0->super_EnumWrapper_);
      name = (String *)Var::Enumerator::operator*((Enumerator *)(pEVar6 + 8));
      while (0 < (local_c0->super_EnumWrapper_).more) {
        pEVar6 = enumData<asl::Var_const>((Var *)0x0,&local_c0->super_EnumWrapper_);
        Var::Enumerator::operator~(&local_118,(Enumerator *)(pEVar6 + 8));
        local_100 = &local_118;
        while ((local_c0->super_EnumWrapper_).more != 0) {
          bVar2 = Var::ok((Var *)name);
          if ((bVar2) && (((this->_json & 1U) != 0 || (name != local_80)))) {
            iVar4 = local_9c + 1;
            bVar2 = 0 < local_9c;
            local_9c = iVar4;
            if (bVar2) {
              asl::String::operator<<(&this->_out,&this->_sep2);
            }
            if ((this->_pretty & 1U) != 0) {
              pSVar7 = asl::String::operator<<(&this->_out,'\n');
              asl::String::operator<<(pSVar7,&this->_indent);
            }
            new_property(this,local_100);
            _encode(this,(Var *)name);
          }
          (local_c0->super_EnumWrapper_).more = (local_c0->super_EnumWrapper_).more + -1;
        }
        value._4_4_ = 0xf;
        asl::String::~String(&local_118);
        (local_c0->super_EnumWrapper_).more = (local_c0->super_EnumWrapper_).more + -2;
      }
      pEVar6 = enumData<asl::Var_const>((Var *)0x0,&local_c0->super_EnumWrapper_);
      Var::Enumerator::operator++((Enumerator *)(pEVar6 + 8));
      (local_c0->super_EnumWrapper_).more = -1 - (local_c0->super_EnumWrapper_).more;
    }
    value._4_4_ = 9;
    EnumWrapper<asl::Var>::~EnumWrapper(&local_e8);
    if ((this->_pretty & 1U) != 0) {
      iVar4 = this->_level + -1;
      this->_level = iVar4;
      asl::String::repeat(&local_130,'\t',iVar4);
      asl::String::operator=(&this->_indent,&local_130);
      asl::String::~String(&local_130);
      pSVar7 = asl::String::operator<<(&this->_out,'\n');
      asl::String::operator<<(pSVar7,&this->_indent);
    }
    end_object(this);
  }
  iVar4 = asl::String::length(&this->_out);
  if (16000 < iVar4) {
    (*this->_sink->_vptr_XdlSink[2])();
  }
  return;
}

Assistant:

void XdlEncoder::_encode(const Var& v)
{
	switch(v._type)
	{
	case Var::FLOAT:
		new_number((float)v._d);
		break;
	case Var::NUMBER:
		new_number(v._d);
		break;
	case Var::INT:
		new_number(v._i);
		break;
	case Var::STRING:
		new_string(v._s->data());
		break;
	case Var::SSTRING:
		new_string(v._ss);
		break;
	case Var::BOOL:
		new_bool(v._b);
		break;
	case Var::ARRAY: {
		begin_array();
		int n = v.length();
		const Var& v0 = n>0? v[0] : v;
		bool multi = (_pretty && (n > 10 || (n>0  && (v0.is(Var::ARRAY) || v0.is(Var::OBJ)))));
		if (_pretty && !multi && v0.is(Var::STRING))
		{
			for (int i = 0, m = 0; i < n; i++)
				if ((m += v[i].length()) > 100)
				{
					multi = true;
					break;
				}
		}
		bool big = false;
		if(multi)
		{
			big = n > 0 && (v0.is(Var::ARRAY) || v0.is(Var::DIC) || v0.is(Var::STRING));
			_indent = String::repeat(INDENT_CHAR, ++_level);
			_out << '\n' << _indent;
		}
		for(int i=0; i<v.length(); i++)
		{
			if(i>0) {
				if (multi && (big || (i % 16) == 0))
					_out << _sep2 << '\n' << _indent;
				else
					_out << _sep1;
			}
			_encode(v[i]);
		}
		if(multi) {
			_indent = String::repeat(INDENT_CHAR, --_level);
			_out << '\n' << _indent;
		}
		end_array();
		break;
		}
	case Var::OBJ: {
		const Var* cname = 0;
		if (!_json)
		{
			cname = v.getp(ASL_XDLCLASS);
			begin_object(cname ? **cname : "");
		}
		else
			begin_object("");
		int k = 0;
		if (_pretty)
			_indent = String::repeat(INDENT_CHAR, ++_level);

		foreach2(String& name, Var& value, v)
		{
			if(value.ok() && (_json || &value != cname))
			{
				if (k++ > 0)
					_out << _sep2;
				if (_pretty)
					_out << '\n' << _indent;

				new_property(name);
				_encode(value);
			}
		}
		if(_pretty) {
			_indent = String::repeat(INDENT_CHAR, --_level);
			_out << '\n' << _indent;
		}
		end_object();
		}
		break;
	case Var::NUL:
		_out << "null";
		break;
	case Var::NONE:
		_out << "null";
		break;
	}

	if (_out.length() > 16000)
		_sink->write(_out);
}